

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_pred.c
# Opt level: O2

void uavs3d_if_hor_ver_chroma
               (pel *src,int i_src,pel *dst,int i_dst,int width,int height,s8 *coeff_h,s8 *coeff_v,
               int max_val)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  undefined2 uVar9;
  sbyte sVar10;
  sbyte sVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  undefined1 *puVar17;
  int iVar18;
  long lVar19;
  undefined1 *puVar20;
  uint uVar21;
  undefined1 *puVar22;
  pel *ppVar23;
  undefined1 *puVar24;
  undefined1 uVar26;
  undefined1 auVar25 [16];
  undefined1 auVar27 [16];
  short sVar28;
  short sVar31;
  undefined1 in_XMM3 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 local_4338 [2];
  undefined1 auStack_4336 [17158];
  
  sVar10 = (max_val != 0xff) * '\x02';
  cVar1 = (max_val == 0xff) * '\x02';
  sVar11 = cVar1 + 10;
  iVar18 = 1 << cVar1 + 9;
  ppVar23 = src + -i_src;
  lVar13 = (long)width;
  if (max_val == 0xff) {
    puVar17 = local_4338;
    for (iVar14 = -1; iVar14 < height + 2; iVar14 = iVar14 + 1) {
      for (lVar19 = 0; lVar19 < lVar13; lVar19 = lVar19 + 2) {
        uVar9 = *(undefined2 *)coeff_h;
        uVar26 = (undefined1)((ushort)uVar9 >> 8);
        auVar25 = psraw(ZEXT416(CONCAT22((short)(CONCAT13(uVar26,CONCAT12(uVar26,uVar9)) >> 0x10),
                                         CONCAT11((char)uVar9,(char)uVar9))),8);
        auVar27._8_8_ = 0;
        auVar27._0_8_ =
             (ulong)CONCAT12((char)((ushort)*(undefined2 *)(ppVar23 + lVar19 + -1) >> 8),
                             *(undefined2 *)(ppVar23 + lVar19 + -1)) & 0xffffffffffff00ff;
        auVar27 = pshuflw(auVar27,auVar27,0xe1);
        auVar29 = pshuflw(in_XMM3,auVar25,0xe1);
        auVar30 = pshuflw(ZEXT416((uint)(int)coeff_h[2]),ZEXT416((uint)(int)coeff_h[2]),0);
        sVar28 = auVar30._0_2_ * (*(ushort *)(ppVar23 + lVar19 + 2) & 0xff);
        sVar31 = auVar30._2_2_ * (*(ushort *)(ppVar23 + lVar19 + 2) >> 8);
        in_XMM3 = ZEXT416(CONCAT22(sVar31,sVar28));
        auVar30 = pshuflw(ZEXT416((uint)(int)coeff_h[3]),ZEXT416((uint)(int)coeff_h[3]),0);
        *(uint *)(puVar17 + lVar19 * 2) =
             CONCAT22(auVar30._2_2_ * (*(ushort *)(ppVar23 + lVar19 + 4) >> 8) + sVar31 +
                      (ushort)ppVar23[lVar19 + 1] * auVar25._2_2_ + auVar29._2_2_ * auVar27._2_2_,
                      auVar30._0_2_ * (*(ushort *)(ppVar23 + lVar19 + 4) & 0xff) + sVar28 +
                      (ushort)ppVar23[lVar19 + -2] * auVar25._0_2_ + auVar29._0_2_ * auVar27._0_2_);
      }
      ppVar23 = ppVar23 + i_src;
      puVar17 = puVar17 + lVar13 * 2;
    }
  }
  else {
    uVar21 = (uint)(1 << sVar10) >> 1;
    puVar17 = local_4338;
    for (iVar14 = -1; iVar14 < height + 2; iVar14 = iVar14 + 1) {
      for (lVar19 = 0; lVar19 < lVar13; lVar19 = lVar19 + 2) {
        cVar1 = *coeff_h;
        cVar2 = coeff_h[1];
        cVar3 = coeff_h[2];
        cVar4 = coeff_h[3];
        bVar5 = ppVar23[lVar19 + -1];
        bVar6 = ppVar23[lVar19 + 1];
        bVar7 = ppVar23[lVar19 + 3];
        bVar8 = ppVar23[lVar19 + 5];
        *(short *)(puVar17 + lVar19 * 2) =
             (short)((int)((uint)ppVar23[lVar19 + -2] * (int)cVar1 + uVar21 +
                           (uint)ppVar23[lVar19 + 2] * (int)cVar3 +
                           (uint)ppVar23[lVar19] * (int)cVar2 +
                          (uint)ppVar23[lVar19 + 4] * (int)cVar4) >> sVar10);
        *(short *)(puVar17 + lVar19 * 2 + 2) =
             (short)((int)((uint)bVar5 * (int)cVar1 + uVar21 +
                           (uint)bVar7 * (int)cVar3 + (uint)bVar6 * (int)cVar2 +
                          (uint)bVar8 * (int)cVar4) >> sVar10);
      }
      ppVar23 = ppVar23 + i_src;
      puVar17 = puVar17 + lVar13 * 2;
    }
  }
  iVar14 = 0;
  if (height < 1) {
    height = iVar14;
  }
  lVar19 = lVar13 * 2;
  puVar22 = auStack_4336 + (long)(width * 2) * 2 + lVar13 * 2;
  puVar24 = auStack_4336 + lVar13 * 4;
  puVar20 = auStack_4336 + lVar13 * 2;
  puVar17 = local_4338;
  for (; iVar14 != height; iVar14 = iVar14 + 1) {
    for (lVar15 = 0; lVar15 < lVar13; lVar15 = lVar15 + 2) {
      iVar12 = (int)*(short *)(puVar17 + lVar15 * 2) * (int)*coeff_v + iVar18 +
               (int)*(short *)(puVar24 + lVar15 * 2 + -2) * (int)coeff_v[2] +
               (int)*(short *)(puVar20 + lVar15 * 2 + -2) * (int)coeff_v[1] +
               (int)*(short *)(puVar22 + lVar15 * 2 + -2) * (int)coeff_v[3] >> sVar11;
      iVar16 = (int)*(short *)(puVar17 + lVar15 * 2 + 2) * (int)*coeff_v + iVar18 +
               (int)*(short *)(puVar24 + lVar15 * 2) * (int)coeff_v[2] +
               (int)*(short *)(puVar20 + lVar15 * 2) * (int)coeff_v[1] +
               (int)*(short *)(puVar22 + lVar15 * 2) * (int)coeff_v[3] >> sVar11;
      if (max_val <= iVar12) {
        iVar12 = max_val;
      }
      if (iVar12 < 1) {
        iVar12 = 0;
      }
      dst[lVar15] = (pel)iVar12;
      if (max_val <= iVar16) {
        iVar16 = max_val;
      }
      if (iVar16 < 1) {
        iVar16 = 0;
      }
      dst[lVar15 + 1] = (pel)iVar16;
    }
    dst = dst + i_dst;
    puVar22 = puVar22 + lVar19;
    puVar24 = puVar24 + lVar19;
    puVar17 = puVar17 + lVar19;
    puVar20 = puVar20 + lVar19;
  }
  return;
}

Assistant:

static void uavs3d_if_hor_ver_chroma(const pel *src, int i_src, pel *dst, int i_dst, int width, int height, const s8 *coeff_h, const s8 *coeff_v, int max_val)
{
    int row, col;
    int sumu, sumv, valu, valv;
    int add1, shift1;
    int add2, shift2;

    ALIGNED_16(s16 tmp_res[(64 + 3) * 64 * 2]); // UV interlaced
    s16 *tmp;

    if (max_val == 255) { // 8 bit_depth
        shift1 = 0;
        shift2 = 12;
    }
    else { // 10 bit_depth
        shift1 = 2;
        shift2 = 10;
    }

    add1 = (1 << (shift1)) >> 1;
    add2 = 1 << (shift2 - 1);

    src += -1 * i_src;
    tmp = tmp_res;

    if (shift1) {
        for (row = -1; row < height + 2; row++) {
            for (col = 0; col < width; col += 2) {
                sumu = FLT_4TAP_HOR(src, col, coeff_h);
                sumv = FLT_4TAP_HOR(src, col + 1, coeff_h);
                tmp[col] = (sumu + add1) >> shift1;
                tmp[col + 1] = (sumv + add1) >> shift1;
            }
            src += i_src;
            tmp += width;
        }
    }
    else {
        for (row = -1; row < height + 2; row++) {
            for (col = 0; col < width; col += 2) {
                tmp[col] = FLT_4TAP_HOR(src, col, coeff_h);
                tmp[col + 1] = FLT_4TAP_HOR(src, col + 1, coeff_h);
            }
            src += i_src;
            tmp += width;
        }
    }

    tmp = tmp_res + 1 * width;

    for (row = 0; row < height; row++) {
        for (col = 0; col < width; col += 2) {
            sumu = FLT_4TAP_VER(tmp, col, width, coeff_v);
            sumv = FLT_4TAP_VER(tmp, col + 1, width, coeff_v);
            valu = (sumu + add2) >> shift2;
            valv = (sumv + add2) >> shift2;
            dst[col] = COM_CLIP3(0, max_val, valu);
            dst[col + 1] = COM_CLIP3(0, max_val, valv);
        }
        dst += i_dst;
        tmp += width;
    }
}